

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int tpl_worker_hook(void *arg1,void *unused)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  pthread_mutex_t *__mutex;
  BLOCK_SIZE BVar4;
  int iVar5;
  uint mi_height_00;
  long *in_RDI;
  int mi_row;
  int mi_height;
  TX_SIZE tx_size;
  BLOCK_SIZE bsize;
  pthread_mutex_t *tpl_error_mutex_;
  AV1TplRowMultiThreadInfo *tpl_row_mt;
  aom_internal_error_info *error_info;
  int num_active_workers;
  CommonModeInfoParams *mi_params;
  TplBuffers *tpl_tmp_buffers;
  TplTxfmStats *tpl_txfm_stats;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  AV1_COMP *cpi;
  EncWorkerData *thread_data;
  BLOCK_SIZE in_stack_000000a3;
  int in_stack_000000a4;
  MACROBLOCK *in_stack_000000a8;
  TplBuffers *in_stack_000000b0;
  TplTxfmStats *in_stack_000000b8;
  AV1_COMP *in_stack_000000c0;
  TX_SIZE in_stack_000000d0;
  int local_84;
  AV1_COMP *cpi_00;
  int local_4;
  
  plVar2 = (long *)*in_RDI;
  lVar3 = in_RDI[1];
  iVar1 = *(int *)(*plVar2 + 0x12348);
  *(long **)(lVar3 + 0x2b90) = in_RDI + 3;
  cpi_00 = (AV1_COMP *)(plVar2 + 0x135ff);
  __mutex = (pthread_mutex_t *)plVar2[0x13600];
  iVar5 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x1e));
  if (iVar5 == 0) {
    *(undefined4 *)(in_RDI + 0x1d) = 1;
    BVar4 = convert_length_to_bsize((uint)*(byte *)(*plVar2 + 0xd2ad));
    mi_height_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [BVar4];
    av1_init_tpl_txfm_stats((TplTxfmStats *)0x2457a3);
    for (local_84 = (int)in_RDI[0x39] * mi_height_00; local_84 < *(int *)((long)plVar2 + 0x3c194);
        local_84 = iVar1 * mi_height_00 + local_84) {
      av1_set_mv_row_limits
                ((CommonModeInfoParams *)(plVar2 + 0x7831),(FullMvLimits *)(lVar3 + 0x1f6e4),
                 local_84,mi_height_00,*(int *)((long)plVar2 + 0x42724));
      *(int *)(lVar3 + 0x209c) = local_84 * -0x20;
      *(uint *)(lVar3 + 0x20a0) =
           ((*(int *)((long)plVar2 + 0x3c194) - mi_height_00) - local_84) * 0x20;
      av1_mc_flow_dispenser_row
                (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                 in_stack_000000a4,in_stack_000000a3,in_stack_000000d0);
    }
    *(undefined4 *)(in_RDI + 0x1d) = 0;
    local_4 = 1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x1d) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)&cpi_00->ppi = 1;
    pthread_mutex_unlock(__mutex);
    set_mode_estimation_done(cpi_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int tpl_worker_hook(void *arg1, void *unused) {
  (void)unused;
  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1_COMP *cpi = thread_data->cpi;
  AV1_COMMON *cm = &cpi->common;
  MACROBLOCK *x = &thread_data->td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  TplTxfmStats *tpl_txfm_stats = &thread_data->td->tpl_txfm_stats;
  TplBuffers *tpl_tmp_buffers = &thread_data->td->tpl_tmp_buffers;
  CommonModeInfoParams *mi_params = &cm->mi_params;
  int num_active_workers = cpi->ppi->tpl_data.tpl_mt_sync.num_threads_working;

  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &cpi->mt_info.tpl_row_mt;
  (void)tpl_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *tpl_error_mutex_ = tpl_row_mt->mutex_;
#endif

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(tpl_error_mutex_);
    tpl_row_mt->tpl_mt_exit = true;
    pthread_mutex_unlock(tpl_error_mutex_);
#endif
    set_mode_estimation_done(cpi);
    return 0;
  }
  error_info->setjmp = 1;

  BLOCK_SIZE bsize = convert_length_to_bsize(cpi->ppi->tpl_data.tpl_bsize_1d);
  TX_SIZE tx_size = max_txsize_lookup[bsize];
  int mi_height = mi_size_high[bsize];

  av1_init_tpl_txfm_stats(tpl_txfm_stats);

  for (int mi_row = thread_data->start * mi_height; mi_row < mi_params->mi_rows;
       mi_row += num_active_workers * mi_height) {
    // Motion estimation row boundary
    av1_set_mv_row_limits(mi_params, &x->mv_limits, mi_row, mi_height,
                          cpi->oxcf.border_in_pixels);
    xd->mb_to_top_edge = -GET_MV_SUBPEL(mi_row * MI_SIZE);
    xd->mb_to_bottom_edge =
        GET_MV_SUBPEL((mi_params->mi_rows - mi_height - mi_row) * MI_SIZE);
    av1_mc_flow_dispenser_row(cpi, tpl_txfm_stats, tpl_tmp_buffers, x, mi_row,
                              bsize, tx_size);
  }
  error_info->setjmp = 0;
  return 1;
}